

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::PushColumnsBackground(void)

{
  ImGuiOldColumns *pIVar1;
  ImGuiWindow *window_00;
  ImGuiOldColumns *columns;
  ImGuiWindow *window;
  
  window_00 = GetCurrentWindowRead();
  pIVar1 = (window_00->DC).CurrentColumns;
  if (pIVar1->Count != 1) {
    (pIVar1->HostBackupClipRect).Min = (window_00->ClipRect).Min;
    (pIVar1->HostBackupClipRect).Max = (window_00->ClipRect).Max;
    SetWindowClipRectBeforeSetChannel(window_00,&pIVar1->HostInitialClipRect);
    ImDrawListSplitter::SetCurrentChannel(&pIVar1->Splitter,window_00->DrawList,0);
  }
  return;
}

Assistant:

void ImGui::PushColumnsBackground()
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    if (columns->Count == 1)
        return;

    // Optimization: avoid SetCurrentChannel() + PushClipRect()
    columns->HostBackupClipRect = window->ClipRect;
    SetWindowClipRectBeforeSetChannel(window, columns->HostInitialClipRect);
    columns->Splitter.SetCurrentChannel(window->DrawList, 0);
}